

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

uint8_t * parse_line_comment(uint8_t *p)

{
  uint local_14;
  byte *pbStack_10;
  int c;
  uint8_t *p_local;
  
  pbStack_10 = p + 1;
LAB_0012aed8:
  do {
    local_14 = (uint)*pbStack_10;
    do {
      if ((local_14 == 10) || (local_14 == 0xffffffff)) {
        return pbStack_10;
      }
      if (local_14 != 0x5c) {
        pbStack_10 = pbStack_10 + 1;
        goto LAB_0012aed8;
      }
      file->buf_ptr = pbStack_10;
      local_14 = handle_eob();
      pbStack_10 = file->buf_ptr;
    } while (local_14 != 0x5c);
    pbStack_10 = pbStack_10 + 1;
    local_14 = (uint)*pbStack_10;
    if (local_14 == 0x5c) {
      file->buf_ptr = pbStack_10;
      local_14 = handle_eob();
      pbStack_10 = file->buf_ptr;
    }
    if (local_14 == 10) {
      file->line_num = file->line_num + 1;
      pbStack_10 = pbStack_10 + 1;
      if (*pbStack_10 == 0x5c) {
        file->buf_ptr = pbStack_10;
        handle_eob();
        pbStack_10 = file->buf_ptr;
      }
    }
    else if (local_14 == 0xd) {
      pbStack_10 = pbStack_10 + 1;
      local_14 = (uint)*pbStack_10;
      if (local_14 == 0x5c) {
        file->buf_ptr = pbStack_10;
        local_14 = handle_eob();
        pbStack_10 = file->buf_ptr;
      }
      if (local_14 == 10) {
        file->line_num = file->line_num + 1;
        pbStack_10 = pbStack_10 + 1;
        if (*pbStack_10 == 0x5c) {
          file->buf_ptr = pbStack_10;
          handle_eob();
          pbStack_10 = file->buf_ptr;
        }
      }
    }
  } while( true );
}

Assistant:

static uint8_t* parse_line_comment(uint8_t* p) {
  int c;

  p++;
  for (;;) {
    c = *p;
  redo:
    if (c == '\n' || c == CH_EOF) {
      break;
    } else if (c == '\\') {
      file->buf_ptr = p;
      c = handle_eob();
      p = file->buf_ptr;
      if (c == '\\') {
        PEEKC_EOB(c, p);
        if (c == '\n') {
          file->line_num++;
          PEEKC_EOB(c, p);
        } else if (c == '\r') {
          PEEKC_EOB(c, p);
          if (c == '\n') {
            file->line_num++;
            PEEKC_EOB(c, p);
          }
        }
      } else {
        goto redo;
      }
    } else {
      p++;
    }
  }
  return p;
}